

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmUnsetMemObj(jx9_vm *pVm,sxu32 nObjIdx)

{
  sxu32 local_30 [2];
  VmSlot sFree;
  jx9_value *pObj;
  sxu32 nObjIdx_local;
  jx9_vm *pVm_local;
  
  sFree.pUserData = SySetAt(&pVm->aMemObj,nObjIdx);
  if ((jx9_value *)sFree.pUserData != (jx9_value *)0x0) {
    jx9MemObjRelease((jx9_value *)sFree.pUserData);
    sFree.nIdx = 0;
    sFree._4_4_ = 0;
    local_30[0] = nObjIdx;
    SySetPut(&pVm->aFreeObj,local_30);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmUnsetMemObj(jx9_vm *pVm,sxu32 nObjIdx)
{
	jx9_value *pObj;
	pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nObjIdx);
	if( pObj ){
		VmSlot sFree;
		/* Release the object */
		jx9MemObjRelease(pObj);
		/* Restore to the free list */
		sFree.nIdx = nObjIdx;
		sFree.pUserData = 0;
		SySetPut(&pVm->aFreeObj, (const void *)&sFree);
	}				
	return SXRET_OK;
}